

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_rewriter.cpp
# Opt level: O0

bool __thiscall MeCab::RewritePattern::set_pattern(RewritePattern *this,char *src,char *dst)

{
  char *pcVar1;
  size_t sVar2;
  char *__dest;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  this_00;
  size_type sVar3;
  char *in_RDX;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RSI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  scoped_fixed_array<char,_8192> buf;
  undefined6 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4e;
  undefined1 in_stack_ffffffffffffff4f;
  byte bVar4;
  scoped_fixed_array<char,_8192> *in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffffe0;
  back_insert_iterator<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  out;
  
  scoped_fixed_array<char,_8192>::scoped_fixed_array(in_stack_ffffffffffffff50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x163878);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)0x163886);
  pcVar1 = scoped_fixed_array<char,_8192>::get
                     ((scoped_fixed_array<char,_8192> *)&stack0xffffffffffffffd0);
  out.container = in_RSI;
  sVar2 = scoped_fixed_array<char,_8192>::size
                    ((scoped_fixed_array<char,_8192> *)&stack0xffffffffffffffd0);
  strncpy(pcVar1,(char *)in_RSI,sVar2);
  scoped_fixed_array<char,_8192>::get((scoped_fixed_array<char,_8192> *)&stack0xffffffffffffffd0);
  std::back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)CONCAT17(in_stack_ffffffffffffff4f,
                         CONCAT16(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48)));
  tokenizeCSV<std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (in_RDX,out,in_stack_ffffffffffffffe0);
  __dest = scoped_fixed_array<char,_8192>::get
                     ((scoped_fixed_array<char,_8192> *)&stack0xffffffffffffffd0);
  pcVar1 = in_RDX;
  sVar2 = scoped_fixed_array<char,_8192>::size
                    ((scoped_fixed_array<char,_8192> *)&stack0xffffffffffffffd0);
  strncpy(__dest,in_RDX,sVar2);
  scoped_fixed_array<char,_8192>::get((scoped_fixed_array<char,_8192> *)&stack0xffffffffffffffd0);
  this_00 = std::
            back_inserter<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
                      ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff4f,
                                   CONCAT16(in_stack_ffffffffffffff4e,in_stack_ffffffffffffff48)));
  tokenizeCSV<std::back_insert_iterator<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            (pcVar1,out,in_stack_ffffffffffffffe0);
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(in_RDI);
  bVar4 = false;
  if (sVar3 != 0) {
    sVar3 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(in_RDI + 1);
    bVar4 = sVar3 != 0;
  }
  scoped_fixed_array<char,_8192>::~scoped_fixed_array
            ((scoped_fixed_array<char,_8192> *)this_00.container);
  return (bool)(bVar4 & 1);
}

Assistant:

bool RewritePattern::set_pattern(const char *src,
                                 const char *dst) {
  scoped_fixed_array<char, BUF_SIZE> buf;
  spat_.clear();
  dpat_.clear();

  std::strncpy(buf.get(), src, buf.size());
  tokenizeCSV(buf.get(), back_inserter(spat_), 512);

  std::strncpy(buf.get(), dst, buf.size());
  tokenizeCSV(buf.get(), back_inserter(dpat_), 512);

  return (spat_.size() && dpat_.size());
}